

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

void __thiscall boost::runtime::basic_param::~basic_param(basic_param *this)

{
  this->_vptr_basic_param = (_func_int **)&PTR__basic_param_001e0df0;
  std::vector<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>::
  ~vector(&this->m_cla_ids);
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::~function1
            (&(this->p_callback).super_function1<void,_boost::unit_test::basic_cstring<const_char>_>
            );
  std::__cxx11::string::~string((string *)&this->p_value_hint);
  std::__cxx11::string::~string((string *)&this->p_env_var);
  std::__cxx11::string::~string((string *)&this->p_help);
  std::__cxx11::string::~string((string *)&this->p_description);
  std::__cxx11::string::~string((string *)&this->p_name);
  return;
}

Assistant:

virtual                 ~basic_param() {}